

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::cliputil::clipTriangleOneVertex
               (vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
                *clippedEdges,ClipVolumePlane *plane,TriangleVertex *clipped,TriangleVertex *v1,
               TriangleVertex *v2)

{
  bool bVar1;
  double a;
  double a_00;
  TriangleVertex *local_1c0;
  TriangleVertex *local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  undefined1 local_190 [8];
  ClipVec4 anotherPointOnLine_1;
  ClipVec4 approximatedClipPoint_1;
  ClipFloat hitDist_1;
  TriangleVertex *middle_1;
  TriangleVertex *outside_1;
  TriangleVertex *inside_1;
  undefined1 local_110 [8];
  ClipVec4 anotherPointOnLine;
  ClipVec4 approximatedClipPoint;
  ClipFloat hitDist;
  TriangleVertex *middle;
  TriangleVertex *outside;
  TriangleVertex *inside;
  undefined1 auStack_a8 [7];
  bool outputDegenerate;
  TriangleVertex mid2;
  TriangleVertex mid1;
  ClipFloat degenerateLimit;
  TriangleVertex *v2_local;
  TriangleVertex *v1_local;
  TriangleVertex *clipped_local;
  ClipVolumePlane *plane_local;
  vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
  *clippedEdges_local;
  
  TriangleVertex::TriangleVertex((TriangleVertex *)(mid2.weight + 2));
  TriangleVertex::TriangleVertex((TriangleVertex *)auStack_a8);
  bVar1 = false;
  (*plane->_vptr_ClipVolumePlane[1])(plane,v1,clipped);
  if (a < 1.0) {
    tcu::mix<4>((Vector<double,_4> *)(anotherPointOnLine.m_data + 3),&v1->position,
                &clipped->position,a);
    local_1b8 = clipped;
    if (0.5 < a) {
      local_1b8 = v1;
    }
    tcu::Vector<double,_4>::Vector((Vector<double,_4> *)local_110,&local_1b8->position);
    (*plane->_vptr_ClipVolumePlane[2])(&inside_1,plane,anotherPointOnLine.m_data + 3,local_110);
    mid2.weight[2] = (ClipFloat)inside_1;
    tcu::mix(v1->weight[0],clipped->weight[0],a);
    tcu::mix(v1->weight[1],clipped->weight[1],a);
    tcu::mix(v1->weight[2],clipped->weight[2],a);
  }
  else {
    bVar1 = true;
  }
  (*plane->_vptr_ClipVolumePlane[1])(plane,v2,clipped);
  if (a_00 < 1.0) {
    tcu::mix<4>((Vector<double,_4> *)(anotherPointOnLine_1.m_data + 3),&v2->position,
                &clipped->position,a_00);
    local_1c0 = clipped;
    if (0.5 < a_00) {
      local_1c0 = v2;
    }
    tcu::Vector<double,_4>::Vector((Vector<double,_4> *)local_190,&local_1c0->position);
    (*plane->_vptr_ClipVolumePlane[2])(&local_1b0,plane,anotherPointOnLine_1.m_data + 3,local_190);
    _auStack_a8 = local_1b0;
    mid2.position.m_data[0] = local_1a8;
    mid2.position.m_data[1] = local_1a0;
    mid2.position.m_data[2] = local_198;
    mid2.position.m_data[3] = tcu::mix(v2->weight[0],clipped->weight[0],a_00);
    mid2.weight[0] = tcu::mix(v2->weight[1],clipped->weight[1],a_00);
    mid2.weight[1] = tcu::mix(v2->weight[2],clipped->weight[2],a_00);
  }
  else {
    bVar1 = true;
  }
  if (bVar1) {
    std::
    vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
    ::push_back(clippedEdges,v1);
    std::
    vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
    ::push_back(clippedEdges,clipped);
    std::
    vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
    ::push_back(clippedEdges,v2);
  }
  else {
    std::
    vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
    ::push_back(clippedEdges,v1);
    std::
    vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
    ::push_back(clippedEdges,(value_type *)(mid2.weight + 2));
    std::
    vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
    ::push_back(clippedEdges,(value_type *)auStack_a8);
    std::
    vector<rr::(anonymous_namespace)::cliputil::TriangleVertex,_std::allocator<rr::(anonymous_namespace)::cliputil::TriangleVertex>_>
    ::push_back(clippedEdges,v2);
  }
  return;
}

Assistant:

void clipTriangleOneVertex (std::vector<TriangleVertex>& clippedEdges, const ClipVolumePlane& plane, const TriangleVertex& clipped, const TriangleVertex& v1, const TriangleVertex& v2)
{
	const ClipFloat	degenerateLimit = (ClipFloat)1.0;

	// calc clip pos
	TriangleVertex	mid1;
	TriangleVertex	mid2;
	bool			outputDegenerate = false;

	{
		const TriangleVertex&	inside	= v1;
		const TriangleVertex&	outside	= clipped;
		      TriangleVertex&	middle	= mid1;

		const ClipFloat			hitDist	= plane.clipLineSegmentEnd(inside.position, outside.position);

		if (hitDist >= degenerateLimit)
		{
			// do not generate degenerate triangles
			outputDegenerate = true;
		}
		else
		{
			const ClipVec4 approximatedClipPoint	= tcu::mix(inside.position, outside.position, hitDist);
			const ClipVec4 anotherPointOnLine		= (hitDist > (ClipFloat)0.5) ? (inside.position) : (outside.position);

			middle.position = plane.getLineIntersectionPoint(approximatedClipPoint, anotherPointOnLine);
			middle.weight[0] = tcu::mix(inside.weight[0], outside.weight[0], hitDist);
			middle.weight[1] = tcu::mix(inside.weight[1], outside.weight[1], hitDist);
			middle.weight[2] = tcu::mix(inside.weight[2], outside.weight[2], hitDist);
		}
	}

	{
		const TriangleVertex&	inside	= v2;
		const TriangleVertex&	outside	= clipped;
		      TriangleVertex&	middle	= mid2;

		const ClipFloat			hitDist	= plane.clipLineSegmentEnd(inside.position, outside.position);

		if (hitDist >= degenerateLimit)
		{
			// do not generate degenerate triangles
			outputDegenerate = true;
		}
		else
		{
			const ClipVec4 approximatedClipPoint	= tcu::mix(inside.position, outside.position, hitDist);
			const ClipVec4 anotherPointOnLine		= (hitDist > (ClipFloat)0.5) ? (inside.position) : (outside.position);

			middle.position = plane.getLineIntersectionPoint(approximatedClipPoint, anotherPointOnLine);
			middle.weight[0] = tcu::mix(inside.weight[0], outside.weight[0], hitDist);
			middle.weight[1] = tcu::mix(inside.weight[1], outside.weight[1], hitDist);
			middle.weight[2] = tcu::mix(inside.weight[2], outside.weight[2], hitDist);
		}
	}

	if (!outputDegenerate)
	{
		// gen quad (v1) -> mid1 -> mid2 -> (v2)
		clippedEdges.push_back(v1);
		clippedEdges.push_back(mid1);
		clippedEdges.push_back(mid2);
		clippedEdges.push_back(v2);
	}
	else
	{
		// don't modify
		clippedEdges.push_back(v1);
		clippedEdges.push_back(clipped);
		clippedEdges.push_back(v2);
	}
}